

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDFHDD.cpp
# Opt level: O0

bool __thiscall HDFHDD::Open(HDFHDD *this,string *path,bool param_2)

{
  int iVar1;
  char *pcVar2;
  ssize_t sVar3;
  int64_t iVar4;
  undefined1 local_37 [8];
  RS_IDE sHeader;
  bool param_2_local;
  string *path_local;
  HDFHDD *this_local;
  
  sHeader.abReserved[3] = param_2;
  unique0x10000355 = path;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = open64(pcVar2,2);
  (this->super_HDD).h = iVar1;
  if (iVar1 == -1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = open64(pcVar2,0);
    (this->super_HDD).h = iVar1;
    if (iVar1 == -1) {
      return false;
    }
  }
  memset(local_37,0,0x16);
  sVar3 = read((this->super_HDD).h,local_37,0x16);
  if (((sVar3 == 0x16) && (sHeader.szSignature[0] == '\0')) &&
     (iVar1 = memcmp(local_37,"RS-IDE",6), iVar1 == 0)) {
    (this->super_HDD).data_offset = (uint)(ushort)sHeader.szSignature._1_2_;
    (this->super_HDD).sIdentify.len = (this->super_HDD).data_offset + -0x16;
    if (0x200 < (this->super_HDD).sIdentify.len) {
      (this->super_HDD).sIdentify.len = 0x200;
    }
    sVar3 = read((this->super_HDD).h,&(this->super_HDD).sIdentify.field_1,
                 (long)(this->super_HDD).sIdentify.len);
    if (sVar3 == (this->super_HDD).sIdentify.len) {
      (this->super_HDD).sector_size = 0x200;
      iVar4 = FileSize(stack0xffffffffffffffe0);
      (this->super_HDD).total_bytes = iVar4 - (this->super_HDD).data_offset;
      (this->super_HDD).total_sectors =
           (this->super_HDD).total_bytes / (long)(this->super_HDD).sector_size & 0xffffffff;
      HDD::SetIdentifyData(&this->super_HDD,&(this->super_HDD).sIdentify);
      return true;
    }
  }
  return false;
}

Assistant:

bool HDFHDD::Open(const std::string& path, bool /*uncached*/)
{
    // Open as read-write, falling back on read-only
    if ((h = open(path.c_str(), O_RDWR | O_BINARY)) == -1 &&
        (h = open(path.c_str(), O_RDONLY | O_BINARY)) == -1)
        return false;

    RS_IDE sHeader = {};

    // Read the header and check for signature
    if (read(h, &sHeader, sizeof(sHeader)) == sizeof(sHeader) && !sHeader.bFlags &&
        !memcmp(sHeader.szSignature, "RS-IDE", sizeof(sHeader.szSignature)))
    {
        // Read start of sector data, and determine identify length from that
        data_offset = (sHeader.bOffsetHigh << 8) | sHeader.bOffsetLow;
        sIdentify.len = data_offset - sizeof(sHeader);

        // Limit identify data size to a single sector
        if (sIdentify.len > SECTOR_SIZE)
            sIdentify.len = SECTOR_SIZE;

        // Read the identify data from the image
        if (read(h, sIdentify.byte, sIdentify.len) == static_cast<int>(sIdentify.len))
        {
            // Sector size is fixed at 512 bytes
            sector_size = SECTOR_SIZE;

            // Byte and sector counts are taken from the file size (excluding the header)
            total_bytes = FileSize(path) - data_offset;
            total_sectors = static_cast<unsigned>(total_bytes / sector_size);

            // Update CHS from the identify data
            SetIdentifyData(&sIdentify);

            return true;
        }
    }

    return false;
}